

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void * array_size_new(t_symbol *s,int argc,t_atom *argv)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  int iVar4;
  t_object *owner;
  _inlet *p_Var5;
  bool bVar6;
  t_array_size *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  owner = (t_object *)pd_new(array_size_class);
  owner[1].te_xpix = 0;
  owner[1].te_ypix = 0;
  owner[1].te_width = 0;
  *(undefined2 *)&owner[1].field_0x2e = 0;
  owner[1].te_inlet = (_inlet *)0x0;
  owner[1].te_g.g_pd = (t_pd)0x0;
  gpointer_init((t_gpointer *)&owner[1].te_g.g_next);
  x = (t_array_size *)argv;
  argv_local._4_4_ = argc;
  while( true ) {
    bVar6 = false;
    if ((argv_local._4_4_ != 0) && (bVar6 = false, *(int *)&(x->x_tc).tc_obj.te_g.g_pd == 2)) {
      bVar6 = *(char *)&((x->x_tc).tc_obj.te_g.g_next)->g_pd->c_name == '-';
    }
    if (!bVar6) break;
    iVar4 = strcmp((char *)((x->x_tc).tc_obj.te_g.g_next)->g_pd,"-s");
    if ((((iVar4 == 0) && (2 < argv_local._4_4_)) && (*(int *)&(x->x_tc).tc_obj.te_binbuf == 2)) &&
       (*(int *)&(x->x_tc).tc_obj.te_inlet == 2)) {
      p_Var5 = (_inlet *)canvas_makebindsym((t_symbol *)(x->x_tc).tc_obj.te_outlet);
      owner[1].te_inlet = p_Var5;
      sVar1 = (x->x_tc).tc_obj.te_ypix;
      sVar2 = (x->x_tc).tc_obj.te_width;
      uVar3 = *(undefined2 *)&(x->x_tc).tc_obj.field_0x2e;
      owner[1].te_xpix = (x->x_tc).tc_obj.te_xpix;
      owner[1].te_ypix = sVar1;
      owner[1].te_width = sVar2;
      *(undefined2 *)&owner[1].field_0x2e = uVar3;
      argv_local._4_4_ = argv_local._4_4_ + -2;
      x = (t_array_size *)&(x->x_tc).tc_obj.te_inlet;
    }
    else {
      pd_error(owner,"array setline: unknown flag ...");
      postatom(argv_local._4_4_,(t_atom *)x);
      endpost();
    }
    argv_local._4_4_ = argv_local._4_4_ + -1;
    x = (t_array_size *)&(x->x_tc).tc_obj.te_binbuf;
  }
  if ((argv_local._4_4_ != 0) && (*(int *)&(x->x_tc).tc_obj.te_g.g_pd == 2)) {
    if (owner[1].te_inlet == (_inlet *)0x0) {
      owner[1].te_g.g_pd = (t_pd)(x->x_tc).tc_obj.te_g.g_next;
    }
    else {
      pd_error(owner,"array setline: extra names after -s..");
      postatom(argv_local._4_4_,(t_atom *)x);
      endpost();
    }
    argv_local._4_4_ = argv_local._4_4_ + -1;
    x = (t_array_size *)&(x->x_tc).tc_obj.te_binbuf;
  }
  if (argv_local._4_4_ != 0) {
    post("warning: array setline ignoring extra argument: ");
    postatom(argv_local._4_4_,(t_atom *)x);
    endpost();
  }
  if (owner[1].te_inlet == (_inlet *)0x0) {
    symbolinlet_new(owner,(t_symbol **)(owner + 1));
  }
  else {
    pointerinlet_new(owner,(t_gpointer *)&owner[1].te_g.g_next);
  }
  outlet_new(owner,&s_float);
  return owner;
}

Assistant:

static void *array_size_new(t_symbol *s, int argc, t_atom *argv)
{
    t_array_size *x = (t_array_size *)pd_new(array_size_class);
    x->x_sym = x->x_struct = x->x_field = 0;
    gpointer_init(&x->x_gp);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        if (!strcmp(argv->a_w.w_symbol->s_name, "-s") &&
            argc >= 3 && argv[1].a_type == A_SYMBOL &&
                argv[2].a_type == A_SYMBOL)
        {
            x->x_struct = canvas_makebindsym(argv[1].a_w.w_symbol);
            x->x_field = argv[2].a_w.w_symbol;
            argc -= 2; argv += 2;
        }
        else
        {
            pd_error(x, "array setline: unknown flag ...");
            postatom(argc, argv); endpost();
        }
        argc--; argv++;
    }
    if (argc && argv->a_type == A_SYMBOL)
    {
        if (x->x_struct)
        {
            pd_error(x, "array setline: extra names after -s..");
            postatom(argc, argv); endpost();
        }
        else x->x_sym = argv->a_w.w_symbol;
        argc--; argv++;
    }
    if (argc)
    {
        post("warning: array setline ignoring extra argument: ");
        postatom(argc, argv); endpost();
    }
    if (x->x_struct)
        pointerinlet_new(&x->x_tc.tc_obj, &x->x_gp);
    else symbolinlet_new(&x->x_tc.tc_obj, &x->x_tc.tc_sym);
    outlet_new(&x->x_tc.tc_obj, &s_float);
    return (x);
}